

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_lqarx(DisasContext_conflict10 *ctx)

{
  int iVar1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *pTVar2;
  TCGv_i64 val;
  TCGv_ptr pTVar3;
  uint uVar4;
  TCGTemp *pTVar5;
  uintptr_t o_4;
  TCGv_i64 pTVar6;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_6;
  code *func;
  TCGv_i64 val_00;
  MemOp_conflict memop;
  uintptr_t o_1;
  uint uVar7;
  uintptr_t o_11;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_7;
  TCGTemp *local_48;
  TCGv_i64 local_40;
  long local_38;
  
  uVar4 = ctx->opcode;
  if ((((uVar4 >> 0x15 & 1) != 0) || (uVar7 = uVar4 >> 0x15 & 0x1f, uVar7 == (uVar4 >> 0x10 & 0x1f))
      ) || (uVar7 == (uVar4 >> 0xb & 0x1f))) {
    gen_exception_err(ctx,0x60,0x21);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x40)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x40
                     );
    ctx->access_type = 0x40;
  }
  pTVar5 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx_00);
  pTVar2 = ctx->uc->tcg_ctx;
  uVar4 = ctx->opcode >> 0x10 & 0x1f;
  pTVar6 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar4 == 0) {
    if (ctx->sf_mode != false) {
      if (pTVar6 != ret) {
        tcg_gen_op2_ppc64(pTVar2,INDEX_op_mov_i64,(TCGArg)((long)pTVar2 + (long)ret),
                          (TCGArg)(pTVar6 + (long)pTVar2));
      }
      goto LAB_00b9476a;
    }
  }
  else {
    tcg_gen_op3_ppc64(pTVar2,INDEX_op_add_i64,(TCGArg)((long)pTVar2 + (long)ret),
                      (TCGArg)((long)&pTVar2->pool_cur + (long)cpu_gpr[uVar4]),
                      (TCGArg)(pTVar6 + (long)pTVar2));
    pTVar6 = ret;
    if (ctx->sf_mode != false) goto LAB_00b9476a;
  }
  tcg_gen_ext32u_i64_ppc64(pTVar2,ret,pTVar6);
LAB_00b9476a:
  pTVar6 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar7 * 8 | 8));
  val = cpu_gpr[uVar7];
  if ((((ctx->base).tb)->cflags & 0x80000) == 0) {
    if (ctx->le_mode == true) {
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,pTVar6,ret,(long)ctx->mem_idx,MO_ALIGN_16|MO_64);
      if (cpu_reserve != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(cpu_reserve + (long)tcg_ctx_00),
                          (TCGArg)pTVar5);
      }
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_addi_i64_ppc64(pTVar2,ret,ret,8);
      if (ctx->sf_mode == false) {
        tcg_gen_ext32u_i64_ppc64(pTVar2,ret,ret);
      }
      iVar1 = ctx->mem_idx;
      memop = MO_64;
      val_00 = val;
    }
    else {
      tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val,ret,(long)ctx->mem_idx,MO_ALIGN_16|MO_BEQ);
      if (cpu_reserve != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(cpu_reserve + (long)tcg_ctx_00),
                          (TCGArg)pTVar5);
      }
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_addi_i64_ppc64(pTVar2,ret,ret,8);
      if (ctx->sf_mode == false) {
        tcg_gen_ext32u_i64_ppc64(pTVar2,ret,ret);
      }
      iVar1 = ctx->mem_idx;
      memop = MO_BEQ;
      val_00 = pTVar6;
    }
    tcg_gen_qemu_ld_i64_ppc64(tcg_ctx_00,val_00,ret,(long)iVar1,memop);
  }
  else {
    pTVar5 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I32,false);
    if (ctx->le_mode == true) {
      tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)pTVar5,
                        (ulong)(uint)ctx->mem_idx | 0x430);
      pTVar3 = tcg_ctx_00->cpu_env;
      func = helper_lq_le_parallel;
    }
    else {
      tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)pTVar5,(ulong)(ctx->mem_idx | 0x4b0));
      pTVar3 = tcg_ctx_00->cpu_env;
      func = helper_lq_be_parallel;
    }
    local_38 = (long)tcg_ctx_00 + ((long)pTVar5 - (long)tcg_ctx_00);
    local_48 = (TCGTemp *)(pTVar3 + (long)tcg_ctx_00);
    local_40 = (TCGv_i64)((long)tcg_ctx_00 + (long)ret);
    tcg_gen_callN_ppc64(tcg_ctx_00,func,(TCGTemp *)(pTVar6 + (long)&tcg_ctx_00->pool_cur),3,
                        &local_48);
    tcg_temp_free_internal_ppc64
              (tcg_ctx_00,(TCGTemp *)(((long)pTVar5 - (long)tcg_ctx_00) + (long)tcg_ctx_00));
    tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)(val + (long)&tcg_ctx_00->pool_cur),
                      (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x2b0);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)(val + (long)tcg_ctx_00),
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x270);
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)(pTVar6 + (long)tcg_ctx_00),
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x278);
  return;
}

Assistant:

static void gen_lqarx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd = rD(ctx->opcode);
    TCGv EA, hi, lo;

    if (unlikely((rd & 1) || (rd == rA(ctx->opcode)) ||
                 (rd == rB(ctx->opcode)))) {
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        return;
    }

    gen_set_access_type(ctx, ACCESS_RES);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);

    /* Note that the low part is always in RD+1, even in LE mode.  */
    lo = cpu_gpr[rd + 1];
    hi = cpu_gpr[rd];

    if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
        if (HAVE_ATOMIC128) {
            TCGv_i32 oi = tcg_temp_new_i32(tcg_ctx);
            if (ctx->le_mode) {
                tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_LEQ | MO_ALIGN_16,
                                                    ctx->mem_idx));
                gen_helper_lq_le_parallel(tcg_ctx, lo, tcg_ctx->cpu_env, EA, oi);
            } else {
                tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_BEQ | MO_ALIGN_16,
                                                    ctx->mem_idx));
                gen_helper_lq_be_parallel(tcg_ctx, lo, tcg_ctx->cpu_env, EA, oi);
            }
            tcg_temp_free_i32(tcg_ctx, oi);
            tcg_gen_ld_i64(tcg_ctx, hi, tcg_ctx->cpu_env, offsetof(CPUPPCState, retxh));
        } else {
            /* Restart with exclusive lock.  */
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            ctx->base.is_jmp = DISAS_NORETURN;
            tcg_temp_free(tcg_ctx, EA);
            return;
        }
    } else if (ctx->le_mode) {
        tcg_gen_qemu_ld_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_LEQ | MO_ALIGN_16);
        tcg_gen_mov_tl(tcg_ctx, cpu_reserve, EA);
        gen_addr_add(ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_LEQ);
    } else {
        tcg_gen_qemu_ld_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_BEQ | MO_ALIGN_16);
        tcg_gen_mov_tl(tcg_ctx, cpu_reserve, EA);
        gen_addr_add(ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_BEQ);
    }
    tcg_temp_free(tcg_ctx, EA);

    tcg_gen_st_tl(tcg_ctx, hi, tcg_ctx->cpu_env, offsetof(CPUPPCState, reserve_val));
    tcg_gen_st_tl(tcg_ctx, lo, tcg_ctx->cpu_env, offsetof(CPUPPCState, reserve_val2));
}